

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool boundScaleOk(vector<double,_std::allocator<double>_> *lower,
                 vector<double,_std::allocator<double>_> *upper,HighsInt bound_scale,
                 double infinite_bound)

{
  size_type sVar1;
  const_reference pvVar2;
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar3;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsInt iCol;
  double bound_scale_value;
  int local_34;
  
  if (in_EDX != 0) {
    std::pow<int,int>(0,0x4f85f7);
    for (local_34 = 0; sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI),
        local_34 < (int)sVar1; local_34 = local_34 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_34);
      if (-INFINITY < *pvVar2) {
        pvVar3 = in_RDI;
        std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_34);
        std::abs((int)pvVar3);
        if (in_XMM0_Qa < extraout_XMM0_Qa) {
          return false;
        }
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_34);
      if (*pvVar2 <= INFINITY && *pvVar2 != INFINITY) {
        pvVar3 = in_RSI;
        std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_34);
        std::abs((int)pvVar3);
        if (in_XMM0_Qa < extraout_XMM0_Qa_00) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool boundScaleOk(const vector<double>& lower, const vector<double>& upper,
                  const HighsInt bound_scale, const double infinite_bound) {
  if (!bound_scale) return true;
  double bound_scale_value = std::pow(2, bound_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(lower.size()); iCol++) {
    if (lower[iCol] > -kHighsInf &&
        std::abs(lower[iCol] * bound_scale_value) > infinite_bound)
      return false;
    if (upper[iCol] < kHighsInf &&
        std::abs(upper[iCol] * bound_scale_value) > infinite_bound)
      return false;
  }
  return true;
}